

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiCutFab.cpp
# Opt level: O1

MultiFab * __thiscall
amrex::MultiCutFab::ToMultiFab
          (MultiFab *__return_storage_ptr__,MultiCutFab *this,Real regular_value,Real covered_value)

{
  uint ncomp;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  MultiCutFab *pMVar3;
  FabArray<amrex::FArrayBox> *pFVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  pointer *ppbVar9;
  long lVar10;
  int iVar11;
  int i;
  long lVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  MFIter mfi;
  Box local_174;
  long local_158;
  Real local_150;
  Real local_148;
  MultiCutFab *local_140;
  FabArray<amrex::FArrayBox> *local_138;
  ulong local_130;
  long local_128;
  ulong local_120;
  Array4<double> local_118;
  undefined1 local_d8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  int local_b0;
  Vector<int,_std::allocator<int>_> *local_a0;
  Vector<int,_std::allocator<int>_> *local_98;
  Array4<const_double> local_70;
  
  ncomp = (this->m_data).super_FabArrayBase.n_comp;
  local_d8._0_8_ =
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  local_d8._8_8_ = (FabArrayBase *)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.p = (double *)&PTR__FabFactory_008378d0;
  local_150 = covered_value;
  local_148 = regular_value;
  MultiFab::MultiFab(__return_storage_ptr__,&(this->m_data).super_FabArrayBase.boxarray,
                     &(this->m_data).super_FabArrayBase.distributionMap,ncomp,
                     (this->m_data).super_FabArrayBase.n_grow.vect[0],(MFInfo *)local_d8,
                     (FabFactory<amrex::FArrayBox> *)&local_118);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8);
  MFIter::MFIter((MFIter *)local_d8,(FabArrayBase *)__return_storage_ptr__,'\0');
  pMVar3 = this;
  pFVar4 = &__return_storage_ptr__->super_FabArray<amrex::FArrayBox>;
  if ((int)local_c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage < local_b0) {
    do {
      local_138 = pFVar4;
      local_140 = pMVar3;
      pFVar4 = local_138;
      pMVar3 = local_140;
      ppbVar9 = &local_c8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (local_98 != (Vector<int,_std::allocator<int>_> *)0x0) {
        ppbVar9 = (pointer *)
                  ((local_98->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start +
                  (int)local_c8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      iVar11 = *(int *)&((local_140->m_cellflags->m_fabs_v).
                         super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar9]->
                        super_BaseFab<amrex::EBCellFlag>).field_0x44;
      FabArrayBase::fabbox
                (&local_174,(FabArrayBase *)local_d8._8_8_,
                 (local_a0->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[(int)local_c8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage]);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_118,pFVar4,(MFIter *)local_d8);
      auVar2 = _DAT_0077bb40;
      auVar1 = _DAT_0077bb30;
      if (iVar11 == 1) {
        FabArray<amrex::CutFab>::const_array<amrex::CutFab,_0>
                  (&local_70,&pMVar3->m_data,(MFIter *)local_d8);
        if (0 < (int)ncomp) {
          local_120 = (ulong)(uint)local_174.bigend.vect[1];
          lVar12 = (long)local_174.smallend.vect[1];
          local_128 = (long)local_174.smallend.vect[0] * 8;
          local_158 = 0;
          uVar8 = 0;
          do {
            local_130 = uVar8;
            iVar11 = local_174.smallend.vect[2];
            if (local_174.smallend.vect[2] <= local_174.bigend.vect[2]) {
              do {
                if (local_174.smallend.vect[1] <= local_174.bigend.vect[1]) {
                  lVar14 = (long)local_118.p +
                           local_118.nstride * local_158 +
                           (lVar12 - local_118.begin.y) * local_118.jstride * 8 +
                           ((long)iVar11 - (long)local_118.begin.z) * local_118.kstride * 8 +
                           (long)local_118.begin.x * -8 + local_128;
                  lVar13 = (long)local_70.p +
                           local_70.nstride * local_158 +
                           (lVar12 - local_70.begin.y) * local_70.jstride * 8 +
                           ((long)iVar11 - (long)local_70.begin.z) * local_70.kstride * 8 +
                           (long)local_70.begin.x * -8 + local_128;
                  lVar6 = lVar12;
                  do {
                    if (local_174.smallend.vect[0] <= local_174.bigend.vect[0]) {
                      lVar10 = 0;
                      do {
                        *(undefined8 *)(lVar14 + lVar10 * 8) = *(undefined8 *)(lVar13 + lVar10 * 8);
                        lVar10 = lVar10 + 1;
                      } while ((local_174.bigend.vect[0] - local_174.smallend.vect[0]) + 1 !=
                               (int)lVar10);
                    }
                    lVar6 = lVar6 + 1;
                    lVar14 = lVar14 + local_118.jstride * 8;
                    lVar13 = lVar13 + local_70.jstride * 8;
                  } while (local_174.bigend.vect[1] + 1U != (int)lVar6);
                }
                bVar15 = iVar11 != local_174.bigend.vect[2];
                iVar11 = iVar11 + 1;
              } while (bVar15);
            }
            local_158 = local_158 + 8;
            uVar8 = local_130 + 1;
          } while (local_130 + 1 != (ulong)ncomp);
        }
      }
      else {
        uVar16 = SUB84(local_148,0);
        uVar17 = (undefined4)((ulong)local_148 >> 0x20);
        if (iVar11 != 0) {
          uVar16 = SUB84(local_150,0);
          uVar17 = (undefined4)((ulong)local_150 >> 0x20);
        }
        if (0 < (int)ncomp) {
          uVar5 = local_174.bigend.vect[0] - local_174.smallend.vect[0];
          auVar18._4_4_ = 0;
          auVar18._0_4_ = uVar5;
          auVar18._8_4_ = uVar5;
          auVar18._12_4_ = 0;
          auVar18 = auVar18 ^ _DAT_0077bb40;
          lVar12 = 0;
          uVar8 = 0;
          do {
            iVar11 = local_174.smallend.vect[2];
            if (local_174.smallend.vect[2] <= local_174.bigend.vect[2]) {
              do {
                if (local_174.smallend.vect[1] <= local_174.bigend.vect[1]) {
                  lVar13 = (long)local_118.p +
                           local_118.nstride * lVar12 +
                           ((long)local_174.smallend.vect[1] - (long)local_118.begin.y) *
                           local_118.jstride * 8 +
                           ((long)iVar11 - (long)local_118.begin.z) * local_118.kstride * 8 +
                           (long)local_118.begin.x * -8 + (long)local_174.smallend.vect[0] * 8 + 8;
                  lVar6 = (long)local_174.smallend.vect[1];
                  do {
                    if (local_174.smallend.vect[0] <= local_174.bigend.vect[0]) {
                      uVar7 = 0;
                      do {
                        auVar19._8_4_ = (int)uVar7;
                        auVar19._0_8_ = uVar7;
                        auVar19._12_4_ = (int)(uVar7 >> 0x20);
                        auVar19 = (auVar19 | auVar1) ^ auVar2;
                        if ((bool)(~(auVar18._4_4_ < auVar19._4_4_ ||
                                    auVar18._0_4_ < auVar19._0_4_ && auVar19._4_4_ == auVar18._4_4_)
                                  & 1)) {
                          *(ulong *)(lVar13 + -8 + uVar7 * 8) = CONCAT44(uVar17,uVar16);
                        }
                        if (auVar19._12_4_ <= auVar18._12_4_ &&
                            (auVar19._8_4_ <= auVar18._8_4_ || auVar19._12_4_ != auVar18._12_4_)) {
                          *(ulong *)(lVar13 + uVar7 * 8) = CONCAT44(uVar17,uVar16);
                        }
                        uVar7 = uVar7 + 2;
                      } while (((ulong)uVar5 + 2 & 0xfffffffffffffffe) != uVar7);
                    }
                    lVar6 = lVar6 + 1;
                    lVar13 = lVar13 + local_118.jstride * 8;
                  } while (local_174.bigend.vect[1] + 1U != (int)lVar6);
                }
                bVar15 = iVar11 != local_174.bigend.vect[2];
                iVar11 = iVar11 + 1;
              } while (bVar15);
            }
            uVar8 = uVar8 + 1;
            lVar12 = lVar12 + 8;
          } while (uVar8 != ncomp);
        }
      }
      MFIter::operator++((MFIter *)local_d8);
      __return_storage_ptr__ = (MultiFab *)local_138;
      pMVar3 = local_140;
      pFVar4 = local_138;
    } while ((int)local_c8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage < local_b0);
  }
  MFIter::~MFIter((MFIter *)local_d8);
  return (MultiFab *)&__return_storage_ptr__->super_FabArray<amrex::FArrayBox>;
}

Assistant:

MultiFab
MultiCutFab::ToMultiFab (Real regular_value, Real covered_value) const
{
    const int ncomp = nComp();
    MultiFab mf(boxArray(), DistributionMap(), ncomp, nGrow());
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mf); mfi.isValid(); ++mfi)
    {
        auto t = (*m_cellflags)[mfi].getType();
        Box const& b = mfi.fabbox();
        Array4<Real> const& d = mf.array(mfi);
        if (t == FabType::singlevalued) {
            Array4<Real const> const& s = m_data.const_array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D(b, ncomp, i, j, k, n,
            {
                d(i,j,k,n) = s(i,j,k,n);
            });
        } else {
            Real val = (t == FabType::regular) ? regular_value : covered_value;
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D(b, ncomp, i, j, k, n,
            {
                d(i,j,k,n) = val;
            });
        }
    }
    return mf;
}